

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UDate __thiscall
icu_63::CalendarAstronomer::getMoonTime(CalendarAstronomer *this,double desired,UBool next)

{
  UDate UVar1;
  MoonTimeAngleFunc func;
  AngleFunc local_8;
  
  local_8._vptr_AngleFunc = (_func_int **)&PTR_eval_003e6458;
  UVar1 = timeOfAngle(this,&local_8,desired,29.530588853,60000.0,next);
  return UVar1;
}

Assistant:

UDate CalendarAstronomer::getMoonTime(double desired, UBool next)
{
    MoonTimeAngleFunc func;
    return timeOfAngle( func,
                        desired,
                        SYNODIC_MONTH,
                        MINUTE_MS,
                        next);
}